

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void Help(void)

{
  fwrite("-d [value] maximum damage bin index\n-i use index file\n-z zip footprint data\n-N no validation checks\n-S suppress all intensity bins present for each vulnerability ID validation checks (recommended for multiple peril models)\n-h help\n-v version\n"
         ,0xf2,1,_stderr);
  return;
}

Assistant:

void Help() {

  fprintf(stderr, "-d [value] maximum damage bin index\n"
		  "-i use index file\n"
		  "-z zip footprint data\n"
		  "-N no validation checks\n"
		  "-S suppress all intensity bins present for each vulnerability ID validation checks (recommended for multiple peril models)\n"
		  "-h help\n"
		  "-v version\n");

}